

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.hpp
# Opt level: O3

int njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SpinGroup::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int in_EAX;
  undefined8 *puVar1;
  int args_1;
  char *args;
  
  args_1 = (int)sig;
  if ((int)ctx == args_1) {
    args_1 = (int)tbs;
    if ((int)siglen == args_1) {
      return in_EAX;
    }
    tools::Log::error<char_const*>("NCH is not consistent with the background R-matrix data");
    tools::Log::info<char_const*,int>("NCH value: {}",(int)siglen);
    args = "Number of channels from background R-matrices: {}";
  }
  else {
    tools::Log::error<char_const*>
              ("KBK is not consistent with the number of channels with a background R-matrix value")
    ;
    tools::Log::info<char_const*,int>("KBK value: {}",(int)ctx);
    args = "Channels with a background R-matrix value: {}";
  }
  tools::Log::info<char_const*,int>(args,args_1);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verify( int KBK1, int KBK2, int NCH1, int NCH2 ) {

  if ( KBK1 != KBK2 ) {

    Log::error( "KBK is not consistent with the number of channels with a "
                "background R-matrix value" );
    Log::info( "KBK value: {}", KBK1 );
    Log::info( "Channels with a background R-matrix value: {}", KBK2 );
    throw std::exception();
  }

  if ( NCH1 != NCH2 ) {

    Log::error( "NCH is not consistent with the background R-matrix data" );
    Log::info( "NCH value: {}", NCH1 );
    Log::info( "Number of channels from background R-matrices: {}", NCH2 );
    throw std::exception();
  }
}